

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O2

int mbedtls_ecdsa_sign_det_restartable
              (mbedtls_ecp_group *grp,mbedtls_mpi *r,mbedtls_mpi *s,mbedtls_mpi *d,uchar *buf,
              size_t blen,mbedtls_md_type_t md_alg,_func_int_void_ptr_uchar_ptr_size_t *f_rng_blind,
              void *p_rng_blind,mbedtls_ecdsa_restart_ctx *rs_ctx)

{
  size_t sVar1;
  int iVar2;
  mbedtls_md_info_t *md_info;
  ulong buflen;
  mbedtls_ecdsa_restart_ctx *in_stack_fffffffffffffee8;
  undefined1 local_108 [8];
  mbedtls_hmac_drbg_context rng_ctx;
  uchar data [64];
  undefined1 local_60 [8];
  mbedtls_mpi h;
  
  sVar1 = grp->nbits;
  h._8_8_ = s;
  md_info = mbedtls_md_info_from_type(md_alg);
  if (md_info == (mbedtls_md_info_t *)0x0) {
    iVar2 = -0x4f80;
  }
  else {
    buflen = sVar1 + 7 >> 3;
    mbedtls_mpi_init((mbedtls_mpi *)local_60);
    mbedtls_hmac_drbg_init((mbedtls_hmac_drbg_context *)local_108);
    iVar2 = mbedtls_mpi_write_binary(d,(uchar *)&rng_ctx.p_entropy,buflen);
    if (iVar2 == 0) {
      iVar2 = derive_mpi(grp,(mbedtls_mpi *)local_60,buf,blen);
      if (iVar2 == 0) {
        iVar2 = mbedtls_mpi_write_binary((mbedtls_mpi *)local_60,rng_ctx.V + buflen + 0x40,buflen);
        if (iVar2 == 0) {
          iVar2 = mbedtls_hmac_drbg_seed_buf
                            ((mbedtls_hmac_drbg_context *)local_108,md_info,
                             (uchar *)&rng_ctx.p_entropy,buflen * 2);
          if (iVar2 == 0) {
            iVar2 = mbedtls_ecdsa_sign_restartable
                              (grp,r,(mbedtls_mpi *)h._8_8_,d,buf,blen,mbedtls_hmac_drbg_random,
                               local_108,f_rng_blind,p_rng_blind,in_stack_fffffffffffffee8);
          }
        }
      }
    }
    mbedtls_hmac_drbg_free((mbedtls_hmac_drbg_context *)local_108);
    mbedtls_mpi_free((mbedtls_mpi *)local_60);
  }
  return iVar2;
}

Assistant:

int mbedtls_ecdsa_sign_det_restartable(mbedtls_ecp_group *grp,
                                       mbedtls_mpi *r, mbedtls_mpi *s,
                                       const mbedtls_mpi *d, const unsigned char *buf, size_t blen,
                                       mbedtls_md_type_t md_alg,
                                       int (*f_rng_blind)(void *, unsigned char *, size_t),
                                       void *p_rng_blind,
                                       mbedtls_ecdsa_restart_ctx *rs_ctx)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_hmac_drbg_context rng_ctx;
    mbedtls_hmac_drbg_context *p_rng = &rng_ctx;
    unsigned char data[2 * MBEDTLS_ECP_MAX_BYTES];
    size_t grp_len = (grp->nbits + 7) / 8;
    const mbedtls_md_info_t *md_info;
    mbedtls_mpi h;

    if ((md_info = mbedtls_md_info_from_type(md_alg)) == NULL) {
        return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    }

    mbedtls_mpi_init(&h);
    mbedtls_hmac_drbg_init(&rng_ctx);

    ECDSA_RS_ENTER(det);

#if defined(MBEDTLS_ECP_RESTARTABLE)
    if (rs_ctx != NULL && rs_ctx->det != NULL) {
        /* redirect to our context */
        p_rng = &rs_ctx->det->rng_ctx;

        /* jump to current step */
        if (rs_ctx->det->state == ecdsa_det_sign) {
            goto sign;
        }
    }
#endif /* MBEDTLS_ECP_RESTARTABLE */

    /* Use private key and message hash (reduced) to initialize HMAC_DRBG */
    MBEDTLS_MPI_CHK(mbedtls_mpi_write_binary(d, data, grp_len));
    MBEDTLS_MPI_CHK(derive_mpi(grp, &h, buf, blen));
    MBEDTLS_MPI_CHK(mbedtls_mpi_write_binary(&h, data + grp_len, grp_len));
    MBEDTLS_MPI_CHK(mbedtls_hmac_drbg_seed_buf(p_rng, md_info, data, 2 * grp_len));

#if defined(MBEDTLS_ECP_RESTARTABLE)
    if (rs_ctx != NULL && rs_ctx->det != NULL) {
        rs_ctx->det->state = ecdsa_det_sign;
    }

sign:
#endif
#if defined(MBEDTLS_ECDSA_SIGN_ALT)
    (void) f_rng_blind;
    (void) p_rng_blind;
    ret = mbedtls_ecdsa_sign(grp, r, s, d, buf, blen,
                             mbedtls_hmac_drbg_random, p_rng);
#else
    ret = mbedtls_ecdsa_sign_restartable(grp, r, s, d, buf, blen,
                                         mbedtls_hmac_drbg_random, p_rng,
                                         f_rng_blind, p_rng_blind, rs_ctx);
#endif /* MBEDTLS_ECDSA_SIGN_ALT */

cleanup:
    mbedtls_hmac_drbg_free(&rng_ctx);
    mbedtls_mpi_free(&h);

    ECDSA_RS_LEAVE(det);

    return ret;
}